

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int*>*,std::vector<boost::iterator_range<int*>,std::allocator<boost::iterator_range<int*>>>>,std::less<void>>>,int[4]>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>_>
          *lhs,char *op,int (*rhs) [4])

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  int (*local_28) [4];
  int (*rhs_local) [4];
  char *op_local;
  iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>_>
  *lhs_local;
  
  local_28 = (int (*) [4])op;
  rhs_local = (int (*) [4])lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>_>,_true>
            (&local_58,
             (iterator_range<burst::merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<int[4],_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }